

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timedependent.cxx
# Opt level: O1

void __thiscall Time::add(Time *this,Estimator *object)

{
  pointer *pppEVar1;
  pointer ppEVar2;
  iterator __position;
  bool bVar3;
  uint uVar4;
  Estimator *local_8;
  
  ppEVar2 = (this->timeEstimators).super__Vector_base<Estimator_*,_std::allocator<Estimator_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (this->timeEstimators).super__Vector_base<Estimator_*,_std::allocator<Estimator_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  uVar4 = 0;
  bVar3 = false;
  do {
    if ((ulong)((long)__position._M_current - (long)ppEVar2 >> 3) <= (ulong)uVar4) {
      if (__position._M_current !=
          (this->timeEstimators).super__Vector_base<Estimator_*,_std::allocator<Estimator_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        *__position._M_current = object;
        pppEVar1 = &(this->timeEstimators).
                    super__Vector_base<Estimator_*,_std::allocator<Estimator_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppEVar1 = *pppEVar1 + 1;
        return;
      }
      local_8 = object;
      std::vector<Estimator*,std::allocator<Estimator*>>::_M_realloc_insert<Estimator*const&>
                ((vector<Estimator*,std::allocator<Estimator*>> *)&this->timeEstimators,__position,
                 &local_8);
      return;
    }
    if (ppEVar2[uVar4] == object) {
      bVar3 = true;
    }
    uVar4 = uVar4 + 1;
  } while (!bVar3);
  return;
}

Assistant:

void Time::add( class Estimator *object )
{
	// find object in already registered objects
	bool found = false;
	for (uint i=0; !found && i<timeEstimators.size(); ++i)
		if (timeEstimators[i] == object)
			found = true;

	// add if not found
	if (!found)
		timeEstimators.push_back( object );
}